

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmStateSnapshot *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  cmake *this_02;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  iterator iVar9;
  element_type *peVar10;
  cmListFileFunction *func;
  pointer pcVar11;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string currentStart;
  string filesDir;
  cmListFile listFile;
  BuildsystemFileScope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [16];
  undefined1 local_168 [32];
  cmLinkedTree<cmStateDetail::SnapshotDataType> local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  pointer pcStack_110;
  pointer local_108;
  string local_f8;
  int local_d4;
  string local_d0;
  cmListFileBacktrace *local_b0;
  cmListFile local_a8;
  BuildsystemFileScope local_68;
  
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_178,this_00);
  psVar8 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_178);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + psVar8->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  local_b0 = &this->Backtrace;
  cmListFileBacktrace::Push((cmListFileBacktrace *)local_178,(string *)local_b0);
  uVar4 = local_178._8_8_;
  uVar3 = local_178._0_8_;
  local_178._0_8_ = (element_type *)0x0;
  local_178._8_8_ = (element_type *)0x0;
  this_01 = (this->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((element_type *)local_178._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  BuildsystemFileScope::BuildsystemFileScope(&local_68,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_178,this_00);
  psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_178);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + psVar8->_M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  cmsys::SystemTools::MakeDirectory(&local_d0,(mode_t *)0x0);
  bVar6 = cmsys::SystemTools::FileExists(&local_f8,true);
  if (!bVar6) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x606,"void cmMakefile::Configure()");
  }
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_PARENT_LIST_FILE","");
  AddDefinition(this,(string *)local_178,local_f8._M_dataplus._M_p);
  if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
    operator_delete((void *)local_178._0_8_,
                    (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                               *)local_168._0_8_)->_M_t)._M_impl.field_0x1);
  }
  local_a8.Filename._M_dataplus._M_p = (pointer)&local_a8.Filename.field_2;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (cmListFileFunction *)0x0;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (cmListFileFunction *)0x0;
  local_a8.Filename._M_string_length = 0;
  local_a8.Filename.field_2._M_local_buf[0] = '\0';
  bVar6 = cmListFile::ParseFile
                    (&local_a8,local_f8._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,local_b0);
  if (!bVar6) goto LAB_00182a04;
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_178,this_00);
  bVar6 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_178);
  pcVar5 = local_a8.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (!bVar6) {
    if (local_a8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001823ce:
      if ((ulong)(((long)local_a8.Functions.
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.Functions.
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111) <
          0x1e) {
        local_168._8_8_ = local_178 + 8;
        local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
        local_168._0_8_ = (cmState *)0x0;
        local_168._24_8_ = 0;
        paVar1 = &local_198.field_2;
        local_198._M_dataplus._M_p = (pointer)paVar1;
        local_168._16_8_ = local_168._8_8_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"project","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"set","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"if","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"endif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"else","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"elseif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"add_executable","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"add_library","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,"target_link_libraries","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"option","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"message","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        pcVar5 = local_a8.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (local_a8.Functions.
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_a8.Functions.
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
        }
        else {
          bVar6 = false;
          pcVar11 = local_a8.Functions.
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_178,(key_type *)pcVar11);
            if (iVar9._M_node == (_Base_ptr)(local_178 + 8)) {
              bVar6 = true;
              break;
            }
            pcVar11 = pcVar11 + 1;
          } while (pcVar11 != pcVar5);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
          if (bVar6) goto LAB_00182721;
        }
      }
      else {
LAB_00182721:
        this->CheckCMP0000 = true;
        local_178._0_8_ = local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"2.4","");
        local_198._M_string_length = 0;
        local_198.field_2._M_local_buf[0] = '\0';
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        cmPolicies::ApplyPolicyVersion(this,(string *)local_178,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
          operator_delete((void *)local_178._0_8_,
                          (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                     *)local_168._0_8_)->_M_t)._M_impl.field_0x1);
        }
      }
    }
    else {
      bVar6 = false;
      pcVar11 = local_a8.Functions.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar7 = std::__cxx11::string::compare((char *)pcVar11);
        if (iVar7 == 0) {
          bVar6 = true;
          break;
        }
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != pcVar5);
      if (!bVar6) goto LAB_001823ce;
    }
    pcVar5 = local_a8.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_a8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar6 = false;
      pcVar11 = local_a8.Functions.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar7 = std::__cxx11::string::compare((char *)pcVar11);
        if (iVar7 == 0) {
          bVar6 = true;
          break;
        }
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != pcVar5);
      if (bVar6) goto LAB_00182964;
    }
    this_02 = this->GlobalGenerator->CMakeInstance;
    local_178._0_8_ = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,
               "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
               ,"");
    cmake::IssueMessage(this_02,AUTHOR_WARNING,(string *)local_178,local_b0);
    if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
      operator_delete((void *)local_178._0_8_,
                      (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                 *)local_168._0_8_)->_M_t)._M_impl.field_0x1);
    }
    local_178._0_8_ = local_168;
    local_178._8_8_ = (element_type *)0x0;
    local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
    local_168._24_8_ = 0;
    local_148.Data.
    super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
    local_148.Data.
    super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcStack_110 = (pointer)0x0;
    local_108 = (pointer)0x0;
    local_168._16_8_ = &local_148;
    std::__cxx11::string::_M_replace((ulong)local_178,0,(char *)0x0,0x5234f3);
    local_198._M_dataplus._M_p = local_198._M_dataplus._M_p & 0xffffffff00000000;
    local_d4 = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const(&)[8],cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_118,
               (char (*) [8])0x53b5b8,(Delimiter *)&local_198,&local_d4);
    local_198._M_dataplus._M_p = local_198._M_dataplus._M_p & 0xffffffff00000000;
    local_d4 = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const(&)[35],cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_118,
               (char (*) [35])"__CMAKE_INJECTED_PROJECT_COMMAND__",(Delimiter *)&local_198,&local_d4
              );
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              (&local_a8.Functions,
               (const_iterator)
               local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start,(value_type *)local_178);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_118);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_168._16_8_ != &local_148) {
      operator_delete((void *)local_168._16_8_,
                      CONCAT71(local_148.Data.
                               super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_148.Data.
                               super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
    }
    if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
      operator_delete((void *)local_178._0_8_,
                      (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                 *)local_168._0_8_)->_M_t)._M_impl.field_0x1);
    }
  }
LAB_00182964:
  ReadListFile(this,&local_a8,&local_f8);
  if ((cmSystemTools::s_FatalErrorOccured != false) ||
     (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
    local_68.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_178,
             &this->UnConfiguredDirectories);
  peVar10 = (element_type *)local_178._0_8_;
  if (local_178._0_8_ != local_178._8_8_) {
    do {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand
                ((cmStateSnapshot *)
                 ((long)&(((_Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                            *)&(peVar10->field_0).Bottom.State)->_M_impl).super__Vector_impl_data.
                         _M_start[1].CompileDefinitions.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 + 8));
      ConfigureSubDirectory
                (this,(cmMakefile *)
                      (((_Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                         *)&(peVar10->field_0).Bottom.State)->_M_impl).super__Vector_impl_data.
                      _M_start);
      peVar10 = (element_type *)&(peVar10->field_0).Bottom.Position;
    } while (peVar10 != (element_type *)local_178._8_8_);
  }
  AddCMakeDependFilesFromUser(this);
  if ((element_type *)local_178._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_178._0_8_,local_168._0_8_ - local_178._0_8_);
  }
LAB_00182a04:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Filename._M_dataplus._M_p != &local_a8.Filename.field_2) {
    operator_delete(local_a8.Filename._M_dataplus._M_p,
                    CONCAT71(local_a8.Filename.field_2._M_allocated_capacity._1_7_,
                             local_a8.Filename.field_2._M_local_buf[0]) + 1);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_a8.Functions)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::~BuildsystemFileScope(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += "/CMakeFiles";
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (allowedCommands.find(func.Name.Lower) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4", std::string());
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project;
      project.Name.Lower = "project";
      project.Arguments.emplace_back("Project", cmListFileArgument::Unquoted,
                                     0);
      project.Arguments.emplace_back("__CMAKE_INJECTED_PROJECT_COMMAND__",
                                     cmListFileArgument::Unquoted, 0);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}